

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

void __thiscall CSocekt::~CSocekt(CSocekt *this)

{
  pointer ppfVar1;
  pointer ppfVar2;
  
  this->_vptr_CSocekt = (_func_int **)&PTR__CSocekt_00129ad0;
  for (ppfVar2 = (this->m_ListenSocketList).
                 super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppfVar2 !=
      (this->m_ListenSocketList).
      super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppfVar2 = ppfVar2 + 1) {
    operator_delete(*ppfVar2);
  }
  ppfVar1 = (this->m_ListenSocketList).
            super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppfVar2 != ppfVar1) {
    (this->m_ListenSocketList).
    super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppfVar1;
  }
  std::
  _Rb_tree<long,_std::pair<const_long,__STRUC_MSG_HEADER_*>,_std::_Select1st<std::pair<const_long,__STRUC_MSG_HEADER_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>_>
  ::~_Rb_tree(&(this->m_timerQueuemap)._M_t);
  pthread_mutex_destroy((pthread_mutex_t *)&this->m_timequeueMutex);
  std::_Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::~_Vector_base
            (&(this->m_threadVector).
              super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>);
  pthread_mutex_destroy((pthread_mutex_t *)&this->m_recvMessageQueueMutex);
  pthread_mutex_destroy((pthread_mutex_t *)&this->m_sendMessageQueueMutex);
  std::__cxx11::_List_base<char_*,_std::allocator<char_*>_>::_M_clear
            (&(this->m_MsgSendQueue).super__List_base<char_*,_std::allocator<char_*>_>);
  std::_Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::~_Vector_base
            (&(this->m_ListenSocketList).
              super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>);
  std::__cxx11::_List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::_M_clear
            (&(this->m_recyconnectionList).
              super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>);
  pthread_mutex_destroy((pthread_mutex_t *)&this->m_recyconnqueueMutex);
  pthread_mutex_destroy((pthread_mutex_t *)&this->m_connectionMutex);
  std::__cxx11::_List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::_M_clear
            (&(this->m_freeconnectionList).
              super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>);
  std::__cxx11::_List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::_M_clear
            (&(this->m_connectionList).
              super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>);
  pthread_mutex_destroy((pthread_mutex_t *)&this->m_pthreadMutex);
  std::__cxx11::_List_base<char_*,_std::allocator<char_*>_>::_M_clear
            (&(this->m_MsgRecvQueue).super__List_base<char_*,_std::allocator<char_*>_>);
  return;
}

Assistant:

CSocekt::~CSocekt()
{
    //释放必须的内存
    //(1)监听端口相关内存的释放--------
    std::vector<lp_listening_t>::iterator pos;	
	for(pos = m_ListenSocketList.begin(); pos != m_ListenSocketList.end(); ++pos) //vector
	{		
		delete (*pos); //一定要把指针指向的内存干掉，不然内存泄漏
	}//end for
	m_ListenSocketList.clear();    
    return;

}